

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlEntityPtr ret;
  xmlEntitiesTablePtr table;
  xmlDictPtr dict;
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  
  table = (xmlEntitiesTablePtr)0x0;
  ret = (xmlEntityPtr)0x0;
  if (name == (xmlChar *)0x0) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else if (dtd == (xmlDtdPtr)0x0) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else {
    if (dtd->doc != (_xmlDoc *)0x0) {
      table = (xmlEntitiesTablePtr)dtd->doc->dict;
    }
    if (type - 1U < 3) {
      if (dtd->entities == (void *)0x0) {
        pxVar2 = xmlHashCreateDict(0,(xmlDictPtr)table);
        dtd->entities = pxVar2;
      }
      ret = (xmlEntityPtr)dtd->entities;
    }
    else if (type - 4U < 2) {
      if (dtd->pentities == (void *)0x0) {
        pxVar2 = xmlHashCreateDict(0,(xmlDictPtr)table);
        dtd->pentities = pxVar2;
      }
      ret = (xmlEntityPtr)dtd->pentities;
    }
    else if (type == 6) {
      return (xmlEntityPtr)0x0;
    }
    if (ret == (xmlEntityPtr)0x0) {
      dtd_local = (xmlDtdPtr)0x0;
    }
    else {
      dtd_local = (xmlDtdPtr)
                  xmlCreateEntity((xmlDictPtr)table,name,type,ExternalID,SystemID,content);
      if ((xmlEntityPtr)dtd_local == (xmlEntityPtr)0x0) {
        dtd_local = (xmlDtdPtr)0x0;
      }
      else {
        ((xmlEntityPtr)dtd_local)->doc = dtd->doc;
        iVar1 = xmlHashAddEntry((xmlHashTablePtr)ret,name,dtd_local);
        if (iVar1 != 0) {
          xmlFreeEntity((xmlEntityPtr)dtd_local);
          dtd_local = (xmlDtdPtr)0x0;
        }
      }
    }
  }
  return (xmlEntityPtr)dtd_local;
}

Assistant:

static xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content) {
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret;

    if (name == NULL)
	return(NULL);
    if (dtd == NULL)
	return(NULL);
    if (dtd->doc != NULL)
        dict = dtd->doc->dict;

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    if (dtd->entities == NULL)
		dtd->entities = xmlHashCreateDict(0, dict);
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL)
		dtd->pentities = xmlHashCreateDict(0, dict);
	    table = dtd->pentities;
	    break;
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return(NULL);
    }
    if (table == NULL)
	return(NULL);
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = dtd->doc;

    if (xmlHashAddEntry(table, name, ret)) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(NULL);
    }
    return(ret);
}